

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O1

void garray_dofo(_garray *x,long npoints,t_float dcval,int nsin,t_float *vsin,int sineflag)

{
  float fVar1;
  char *pcVar2;
  double dVar3;
  int iVar4;
  _array *p_Var5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  int elemsize;
  int yonset;
  int local_70;
  int local_6c;
  _garray *local_68;
  long local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  p_Var5 = garray_getarray_floatonly(x,&local_6c,&local_70);
  if (p_Var5 == (_array *)0x0) {
    pd_error((void *)0x0,"%s: needs floating-point \'y\' field",x->x_realname->s_name);
    return;
  }
  lVar6 = 0x200;
  if (npoints != 0) {
    lVar6 = npoints;
  }
  iVar4 = ilog2((int)lVar6);
  if (lVar6 != 1 << ((byte)iVar4 & 0x1f)) {
    pcVar2 = p_Var5->a_templatesym->s_name;
    iVar4 = ilog2((int)lVar6);
    lVar6 = (long)(1 << ((byte)iVar4 & 0x1f));
    post("%s: rounding to %d points",pcVar2,lVar6);
  }
  local_68 = x;
  garray_resize_long(x,lVar6 + 3);
  if (0 < p_Var5->a_n) {
    local_48 = 6.28318 / (double)lVar6;
    uStack_50 = 0x8000000000000000;
    uStack_40 = 0;
    dVar9 = -local_48;
    local_60 = (long)local_70;
    lVar6 = 0;
    do {
      local_58 = dVar9;
      if (sineflag == 0) {
        if (nsin < 1) goto LAB_00135955;
        dVar3 = 0.0;
        uVar7 = 0;
        dVar9 = 0.0;
        do {
          fVar1 = vsin[uVar7];
          dVar8 = cos(dVar9);
          dVar3 = dVar3 + dVar8 * (double)fVar1;
          uVar7 = uVar7 + 1;
          dVar9 = dVar9 + local_58;
        } while ((uint)nsin != uVar7);
      }
      else if (nsin < 1) {
LAB_00135955:
        dVar3 = 0.0;
      }
      else {
        dVar3 = 0.0;
        uVar7 = 0;
        do {
          fVar1 = vsin[uVar7];
          dVar8 = sin(dVar9);
          dVar3 = dVar3 + dVar8 * (double)fVar1;
          uVar7 = uVar7 + 1;
          dVar9 = dVar9 + local_58;
        } while ((uint)nsin != uVar7);
      }
      *(float *)(p_Var5->a_vec + (long)local_6c * 4 + lVar6 * local_60) = (float)dVar3;
      lVar6 = lVar6 + 1;
      dVar9 = local_58 + local_48;
    } while (lVar6 < p_Var5->a_n);
  }
  garray_redraw(local_68);
  return;
}

Assistant:

static void garray_dofo(t_garray *x, long npoints, t_float dcval,
    int nsin, t_float *vsin, int sineflag)
{
    double phase, phaseincr, fj;
    int yonset, i, j, elemsize;
    t_array *array = garray_getarray_floatonly(x, &yonset, &elemsize);
    if (!array)
    {
        pd_error(0, "%s: needs floating-point 'y' field", x->x_realname->s_name);
        return;
    }
    if (npoints == 0)
        npoints = 512;  /* dunno what a good default would be... */
    if (npoints != (1 << ilog2((int)npoints)))
        post("%s: rounding to %d points", array->a_templatesym->s_name,
            (npoints = (1<<ilog2((int)npoints))));
    garray_resize_long(x, npoints + 3);
    phaseincr = 2. * 3.14159 / npoints;
    for (i = 0, phase = -phaseincr; i < array->a_n; i++, phase += phaseincr)
    {
        double sum = dcval;
        if (sineflag)
            for (j = 0, fj = phase; j < nsin; j++, fj += phase)
                sum += vsin[j] * sin(fj);
        else
            for (j = 0, fj = 0; j < nsin; j++, fj += phase)
                sum += vsin[j] * cos(fj);
        *((t_float *)((array->a_vec + elemsize * i)) + yonset)
            = sum;
    }
    garray_redraw(x);
}